

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

DoubleFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_doubletype(FeatureType *this)

{
  DoubleFeatureType *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (DoubleFeatureType *)(this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 2;
    this_00 = (DoubleFeatureType *)operator_new(0x18);
    DoubleFeatureType::DoubleFeatureType(this_00);
    (this->Type_).doubletype_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::DoubleFeatureType* FeatureType::mutable_doubletype() {
  if (!has_doubletype()) {
    clear_Type();
    set_has_doubletype();
    Type_.doubletype_ = new ::CoreML::Specification::DoubleFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.doubleType)
  return Type_.doubletype_;
}